

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzerResults.cpp
# Opt level: O0

void __thiscall
USBAnalyzerResults::USBAnalyzerResults
          (USBAnalyzerResults *this,USBAnalyzer *analyzer,USBAnalyzerSettings *settings)

{
  USBAnalyzerSettings *settings_local;
  USBAnalyzer *analyzer_local;
  USBAnalyzerResults *this_local;
  
  AnalyzerResults::AnalyzerResults(&this->super_AnalyzerResults);
  *(undefined ***)this = &PTR__USBAnalyzerResults_0018e230;
  this->mSettings = settings;
  this->mAnalyzer = analyzer;
  std::
  map<std::pair<unsigned_char,_unsigned_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<unsigned_char,_unsigned_char>_>,_std::allocator<std::pair<const_std::pair<unsigned_char,_unsigned_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->mAllStringDescriptors);
  return;
}

Assistant:

USBAnalyzerResults::USBAnalyzerResults( USBAnalyzer* analyzer, USBAnalyzerSettings* settings )
    : mSettings( settings ), mAnalyzer( analyzer )
{
}